

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,long i)

{
  QTextStreamPrivate *this_00;
  qulonglong number;
  
  this_00 = (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t
            .super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
            super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if ((this_00->string == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    operator<<((QTextStream *)this_00);
  }
  else {
    number = -i;
    if (0 < i) {
      number = i;
    }
    QTextStreamPrivate::putNumber(this_00,number,SUB81((ulong)i >> 0x3f,0));
  }
  return this;
}

Assistant:

QTextStream &QTextStream::operator<<(signed long i)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->putNumber(QtPrivate::qUnsignedAbs(i), i < 0);
    return *this;
}